

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void __thiscall
Rml::ElementDocument::Show(ElementDocument *this,ModalFlag modal_flag,FocusFlag focus_flag)

{
  Element *this_00;
  bool bVar1;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_d8;
  undefined1 local_ba;
  allocator<char> local_b9;
  undefined1 local_b8 [6];
  bool focused;
  Element *local_98;
  Element *element;
  Element *first_element;
  Element *focus_element;
  Property local_70;
  byte local_1b;
  byte local_1a;
  byte local_19;
  FocusFlag local_18;
  bool focus_previous;
  bool autofocus;
  ModalFlag MStack_14;
  bool focus;
  FocusFlag focus_flag_local;
  ModalFlag modal_flag_local;
  ElementDocument *this_local;
  
  if (modal_flag == None) {
    this->modal = false;
  }
  else if (modal_flag == Modal) {
    this->modal = true;
  }
  local_19 = 0;
  local_1a = 0;
  local_1b = 0;
  switch(focus_flag) {
  case None:
    break;
  case Document:
    local_19 = 1;
    break;
  case Keep:
    local_19 = 1;
    local_1b = 1;
    break;
  case Auto:
    local_19 = 1;
    local_1a = 1;
  }
  local_18 = focus_flag;
  MStack_14 = modal_flag;
  _focus_flag_local = this;
  Property::Property<Rml::Style::Visibility,Rml::Style::Visibility>(&local_70,Visible);
  Element::SetProperty(&this->super_Element,Visibility,&local_70);
  Property::~Property(&local_70);
  UpdateDocument(this);
  if ((local_19 & 1) != 0) {
    first_element = &this->super_Element;
    if ((local_1a & 1) == 0) {
      if ((local_1b & 1) != 0) {
        first_element = Element::GetFocusLeafNode(&this->super_Element);
      }
    }
    else {
      element = (Element *)0x0;
      for (local_98 = FindNextTabElement(this,&this->super_Element,true); this_00 = local_98,
          local_98 != (Element *)0x0 && local_98 != element;
          local_98 = FindNextTabElement(this,local_98,true)) {
        if (element == (Element *)0x0) {
          element = local_98;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b8,"autofocus",&local_b9);
        bVar1 = Element::HasAttribute(this_00,(String *)local_b8);
        ::std::__cxx11::string::~string((string *)local_b8);
        ::std::allocator<char>::~allocator(&local_b9);
        if (bVar1) {
          first_element = local_98;
          break;
        }
      }
    }
    local_ba = Element::Focus(first_element,true);
    if (((bool)local_ba) && ((ElementDocument *)first_element != this)) {
      Element::ScrollIntoView(first_element,false);
    }
  }
  local_d8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map(&local_d8);
  Element::DispatchEvent(&this->super_Element,Show,&local_d8);
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map(&local_d8);
  return;
}

Assistant:

void ElementDocument::Show(ModalFlag modal_flag, FocusFlag focus_flag)
{
	switch (modal_flag)
	{
	case ModalFlag::None: modal = false; break;
	case ModalFlag::Modal: modal = true; break;
	case ModalFlag::Keep: break;
	}

	bool focus = false;
	bool autofocus = false;
	bool focus_previous = false;

	switch (focus_flag)
	{
	case FocusFlag::None: break;
	case FocusFlag::Document: focus = true; break;
	case FocusFlag::Keep:
		focus = true;
		focus_previous = true;
		break;
	case FocusFlag::Auto:
		focus = true;
		autofocus = true;
		break;
	}

	// Set to visible and switch focus if necessary.
	SetProperty(PropertyId::Visibility, Property(Style::Visibility::Visible));

	// Update the document now, otherwise the focusing methods below do not think we are visible. This is also important
	// to ensure correct layout for any event handlers, such as for focused input fields to submit the proper caret
	// position.
	UpdateDocument();

	if (focus)
	{
		Element* focus_element = this;

		if (autofocus)
		{
			Element* first_element = nullptr;
			Element* element = FindNextTabElement(this, true);

			while (element && element != first_element)
			{
				if (!first_element)
					first_element = element;

				if (element->HasAttribute("autofocus"))
				{
					focus_element = element;
					break;
				}

				element = FindNextTabElement(element, true);
			}
		}
		else if (focus_previous)
		{
			focus_element = GetFocusLeafNode();
		}

		// Focus the window or element
		bool focused = focus_element->Focus(true);
		if (focused && focus_element != this)
			focus_element->ScrollIntoView(false);
	}

	DispatchEvent(EventId::Show, Dictionary());
}